

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScapeGoatTree.cpp
# Opt level: O0

bool __thiscall ScapeGoatTree::removeBST(ScapeGoatTree *this,int value)

{
  Node *local_30;
  Node *location;
  Node *parent;
  ScapeGoatTree *pSStack_18;
  int value_local;
  ScapeGoatTree *this_local;
  
  if (this->root == (Node *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    parent._4_4_ = value;
    pSStack_18 = this;
    find(this,value,&location,&local_30);
    if (local_30 == (Node *)0x0) {
      this_local._7_1_ = false;
    }
    else {
      if ((local_30->leftChild == (Node *)0x0) && (local_30->rightChild == (Node *)0x0)) {
        caseA(this,location,local_30);
      }
      if ((local_30->leftChild != (Node *)0x0) && (local_30->rightChild == (Node *)0x0)) {
        caseB(this,location,local_30);
      }
      if ((local_30->leftChild == (Node *)0x0) && (local_30->rightChild != (Node *)0x0)) {
        caseB(this,location,local_30);
      }
      if ((local_30->leftChild != (Node *)0x0) && (local_30->rightChild != (Node *)0x0)) {
        caseC(this,location,local_30);
      }
      if (local_30 != (Node *)0x0) {
        operator_delete(local_30,0x20);
      }
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ScapeGoatTree::removeBST(int value) {
    Node *parent, *location;
    if (root == nullptr) {
        return false;
    }
    find(value, &parent, &location);
    if (location == nullptr) {
        return false;
    }
    if (location->leftChild == nullptr && location->rightChild == nullptr) {
        caseA(parent, location);
    }
    if (location->leftChild != nullptr && location->rightChild == nullptr) {
        caseB(parent, location);
    }
    if (location->leftChild == nullptr && location->rightChild != nullptr) {
        caseB(parent, location);
    }
    if (location->leftChild != nullptr && location->rightChild != nullptr) {
        caseC(parent, location);
    }
    delete location;
    return true;
}